

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

UINT32 __thiscall DROPlayer::GetCurPos(DROPlayer *this,UINT8 unit)

{
  UINT32 UVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,unit);
  if (iVar2 == 2) {
    UVar1 = this->_playSmpl;
  }
  else {
    if (iVar2 == 1) {
      return this->_playTick;
    }
    UVar1 = 0xffffffff;
    if (iVar2 == 0) {
      return this->_filePos;
    }
  }
  return UVar1;
}

Assistant:

UINT32 DROPlayer::GetCurPos(UINT8 unit) const
{
	switch(unit)
	{
	case PLAYPOS_FILEOFS:
		return _filePos;
	case PLAYPOS_TICK:
		return _playTick;
	case PLAYPOS_SAMPLE:
		return _playSmpl;
	case PLAYPOS_COMMAND:
	default:
		return (UINT32)-1;
	}
}